

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O1

void Bitmap_Operation::Load(string *path,Image *raw)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  Image local_38;
  
  Load(&local_38,path);
  uVar5._0_4_ = raw->_width;
  uVar5._4_4_ = raw->_height;
  raw->_width = local_38._width;
  raw->_height = local_38._height;
  uVar1 = raw->_colorCount;
  raw->_colorCount = local_38._colorCount;
  uVar4 = raw->_rowSize;
  raw->_rowSize = local_38._rowSize;
  uVar2 = raw->_alignment;
  raw->_alignment = local_38._alignment;
  puVar6 = raw->_data;
  raw->_data = local_38._data;
  uVar3 = raw->_type;
  raw->_type = local_38._type;
  local_38._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
  local_38._8_8_ = uVar5;
  local_38._colorCount = uVar1;
  local_38._alignment = uVar2;
  local_38._rowSize = uVar4;
  local_38._data = puVar6;
  local_38._type = uVar3;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_38);
  return;
}

Assistant:

void Load( const std::string & path, PenguinV_Image::Image & raw )
    {
        raw = Load( path );
    }